

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QCborValue * QCborValue::fromVariant(QCborValue *__return_storage_ptr__,QVariant *variant)

{
  PrivateShared *pPVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [8];
  undefined8 uVar8;
  bool bVar9;
  undefined1 uVar10;
  int iVar11;
  Type TVar12;
  QMetaType QVar13;
  qlonglong qVar14;
  qulonglong qVar15;
  qsizetype objectSize;
  long in_FS_OFFSET;
  QJsonDocument doc;
  QJsonArray QStack_48;
  undefined1 local_40 [8];
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QVar13 = ::QVariant::metaType(variant);
  if (QVar13.d_ptr == (QMetaTypeInterface *)0x0) {
switchD_002ed7ba_caseD_0:
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Undefined;
    goto LAB_002ed7e8;
  }
  iVar11 = ((QVar13.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
  if (iVar11 == 0) {
    iVar11 = QMetaType::registerHelper(QVar13.d_ptr);
  }
  switch(iVar11) {
  case 0:
    goto switchD_002ed7ba_caseD_0;
  case 1:
    bVar9 = ::QVariant::toBool(variant);
    TVar12 = (uint)bVar9 | False;
    goto LAB_002edd69;
  case 2:
  case 3:
  case 4:
  case 0x20:
  case 0x21:
  case 0x24:
    goto switchD_002ed7ba_caseD_2;
  case 5:
  case 0x23:
    qVar15 = ::QVariant::toULongLong(variant,(bool *)0x0);
    if ((long)qVar15 < 0) goto switchD_002ed7ba_caseD_6;
    goto switchD_002ed7ba_caseD_2;
  case 6:
  case 0x26:
  case 0x3f:
switchD_002ed7ba_caseD_6:
    dVar2 = ::QVariant::toDouble(variant,(bool *)0x0);
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Double;
    __return_storage_ptr__->n = (qint64)dVar2;
    break;
  default:
    bVar9 = ::QVariant::isNull(variant);
    if (!bVar9) {
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toString((QString *)local_38,variant);
      if ((uchar  [8])local_38._8_8_ == (uchar  [8])0x0) {
        __return_storage_ptr__->n = 0;
        __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
        __return_storage_ptr__->t = Undefined;
      }
      else {
        QCborValue((QCborValue *)__return_storage_ptr__,(QString *)local_38);
      }
      goto LAB_002edf4a;
    }
  case 0x33:
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Null;
    break;
  case 8:
    ::QVariant::toMap((QVariant *)local_40);
    QCborMap::fromVariantMap((QCborMap *)local_38,(QVariantMap *)local_40);
    __return_storage_ptr__->n = -1;
    uVar8 = local_38._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar5 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar8;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_38);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)local_40);
    break;
  case 9:
    ::QVariant::toList((QVariantList *)local_38,variant);
    QCborArray::fromVariantList((QCborArray *)local_40,(QVariantList *)local_38);
    auVar7 = local_40;
    __return_storage_ptr__->n = -1;
    local_40 = (undefined1  [8])0x0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)auVar7;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_40);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_38);
    break;
  case 10:
    ::QVariant::toString((QString *)local_38,variant);
    QCborValue((QCborValue *)__return_storage_ptr__,(QString *)local_38);
LAB_002edf4a:
    if ((QArrayData *)local_38._0_8_ == (QArrayData *)0x0) break;
    LOCK();
    *(int *)local_38._0_8_ = *(int *)local_38._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_38._0_8_ != 0) break;
    objectSize = 2;
    goto LAB_002edf6b;
  case 0xb:
    ::QVariant::toStringList((QStringList *)local_38,variant);
    QCborArray::fromStringList((QCborArray *)local_40,(QStringList *)local_38);
    auVar7 = local_40;
    __return_storage_ptr__->n = -1;
    local_40 = (undefined1  [8])0x0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)auVar7;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_40);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_38);
    break;
  case 0xc:
    ::QVariant::toByteArray((QByteArray *)local_38,variant);
    QCborValue((QCborValue *)__return_storage_ptr__,(QByteArray *)local_38);
    if ((QArrayData *)local_38._0_8_ == (QArrayData *)0x0) break;
    LOCK();
    *(int *)local_38._0_8_ = *(int *)local_38._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_38._0_8_ != 0) break;
    objectSize = 1;
LAB_002edf6b:
    QArrayData::deallocate((QArrayData *)local_38._0_8_,objectSize,0x10);
    break;
  case 0x10:
    ::QVariant::toDateTime((QVariant *)local_38);
    QCborValue((QCborValue *)__return_storage_ptr__,(QDateTime *)local_38);
    QDateTime::~QDateTime((QDateTime *)local_38);
    break;
  case 0x11:
    ::QVariant::toUrl((QVariant *)local_38);
    QCborValue((QCborValue *)__return_storage_ptr__,(QUrl *)local_38);
    QUrl::~QUrl((QUrl *)local_38);
    break;
  case 0x1c:
    ::QVariant::toHash((QVariant *)local_40);
    QCborMap::fromVariantHash((QCborMap *)local_38,(QVariantHash *)local_40);
    __return_storage_ptr__->n = -1;
    uVar8 = local_38._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar3 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar8;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_38);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)local_40);
    break;
  case 0x1e:
    local_38._0_16_ = (undefined1  [16])::QVariant::toUuid(variant);
    QCborValue((QCborValue *)__return_storage_ptr__,(QUuid *)local_38);
    break;
  case 0x2c:
    ::QVariant::toRegularExpression((QVariant *)local_38);
    QCborValue((QCborValue *)__return_storage_ptr__,(QRegularExpression *)local_38);
    QRegularExpression::~QRegularExpression((QRegularExpression *)local_38);
    break;
  case 0x2d:
    ::QVariant::toJsonValue((QJsonValue *)local_38,variant);
    fromJsonValue(__return_storage_ptr__,(QJsonValue *)local_38);
    QJsonValue::~QJsonValue((QJsonValue *)local_38);
    break;
  case 0x2e:
    ::QVariant::toJsonObject((QVariant *)local_40);
    QCborMap::fromJsonObject((QCborMap *)local_38,(QJsonObject *)local_40);
    __return_storage_ptr__->n = -1;
    uVar8 = local_38._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar4 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar8;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_38);
    QJsonObject::~QJsonObject((QJsonObject *)local_40);
    break;
  case 0x2f:
    ::QVariant::toJsonArray((QVariant *)local_40);
    QCborArray::fromJsonArray((QCborArray *)local_38,(QJsonArray *)local_40);
    __return_storage_ptr__->n = -1;
    uVar8 = local_38._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_38._8_8_;
    local_38._0_16_ = auVar6 << 0x40;
    __return_storage_ptr__->container = (QCborContainerPrivate *)uVar8;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_38);
    QJsonArray::~QJsonArray((QJsonArray *)local_40);
    break;
  case 0x30:
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toJsonDocument((QVariant *)local_38);
    bVar9 = QJsonDocument::isArray((QJsonDocument *)local_38);
    if (bVar9) {
      QJsonDocument::array((QJsonDocument *)&QStack_48);
      QCborArray::fromJsonArray((QCborArray *)local_40,&QStack_48);
      auVar7 = local_40;
      __return_storage_ptr__->n = -1;
      local_40 = (undefined1  [8])0x0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)auVar7;
      __return_storage_ptr__->t = Array;
      QCborArray::~QCborArray((QCborArray *)local_40);
      QJsonArray::~QJsonArray(&QStack_48);
    }
    else {
      QJsonDocument::object((QJsonDocument *)&QStack_48);
      QCborMap::fromJsonObject((QCborMap *)local_40,(QJsonObject *)&QStack_48);
      auVar7 = local_40;
      __return_storage_ptr__->n = -1;
      local_40 = (undefined1  [8])0x0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)auVar7;
      __return_storage_ptr__->t = Map;
      QCborMap::~QCborMap((QCborMap *)local_40);
      QJsonObject::~QJsonObject((QJsonObject *)&QStack_48);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_38);
    break;
  case 0x34:
    local_38._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborSimpleType>::metaType;
    local_40 = (undefined1  [8])(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar9 = ::comparesEqual((QMetaType *)local_40,(QMetaType *)local_38);
    if (bVar9) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      uVar10 = (variant->d).data.data[0];
    }
    else {
      local_40 = (undefined1  [8])((ulong)local_40 & 0xffffffffffffff00);
      QVar13 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar13,variant,(QMetaType)local_38._0_8_,local_40);
      uVar10 = local_40[0];
    }
    TVar12 = (uint)(byte)uVar10 | SimpleType;
LAB_002edd69:
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = TVar12;
    break;
  case 0x35:
    local_38._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborValue>::metaType;
    local_40 = (undefined1  [8])(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar9 = ::comparesEqual((QMetaType *)local_40,(QMetaType *)local_38);
    if (bVar9) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborValue((QCborValue *)__return_storage_ptr__,(QCborValue *)variant);
    }
    else {
      *(undefined8 *)&__return_storage_ptr__->t = 0xaaaaaaaa00000117;
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      QVar13 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar13,variant,(QMetaType)local_38._0_8_,__return_storage_ptr__);
    }
    break;
  case 0x36:
    local_38._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborArray>::metaType;
    local_40 = (undefined1  [8])(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar9 = ::comparesEqual((QMetaType *)local_40,(QMetaType *)local_38);
    if (bVar9) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborArray::QCborArray((QCborArray *)local_40,(QCborArray *)variant);
    }
    else {
      local_40 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      QCborArray::QCborArray((QCborArray *)local_40);
      QVar13 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar13,variant,(QMetaType)local_38._0_8_,local_40);
    }
    auVar7 = local_40;
    __return_storage_ptr__->n = -1;
    local_40 = (undefined1  [8])0x0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)auVar7;
    __return_storage_ptr__->t = Array;
    QCborArray::~QCborArray((QCborArray *)local_40);
    break;
  case 0x37:
    local_38._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborMap>::metaType;
    local_40 = (undefined1  [8])(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar9 = ::comparesEqual((QMetaType *)local_40,(QMetaType *)local_38);
    if (bVar9) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborMap::QCborMap((QCborMap *)local_40,(QCborMap *)variant);
    }
    else {
      local_40 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      QCborMap::QCborMap((QCborMap *)local_40);
      QVar13 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar13,variant,(QMetaType)local_38._0_8_,local_40);
    }
    auVar7 = local_40;
    __return_storage_ptr__->n = -1;
    local_40 = (undefined1  [8])0x0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)auVar7;
    __return_storage_ptr__->t = Map;
    QCborMap::~QCborMap((QCborMap *)local_40);
  }
LAB_002ed7e8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
switchD_002ed7ba_caseD_2:
  qVar14 = ::QVariant::toLongLong(variant,(bool *)0x0);
  __return_storage_ptr__->n = qVar14;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Integer;
  goto LAB_002ed7e8;
}

Assistant:

QCborValue QCborValue::fromVariant(const QVariant &variant)
{
    switch (variant.metaType().id()) {
    case QMetaType::UnknownType:
        return {};
    case QMetaType::Nullptr:
        return nullptr;
    case QMetaType::Bool:
        return variant.toBool();
    case QMetaType::Short:
    case QMetaType::UShort:
    case QMetaType::Int:
    case QMetaType::LongLong:
    case QMetaType::Long:
    case QMetaType::UInt:
        return variant.toLongLong();
    case QMetaType::ULong:
    case QMetaType::ULongLong:
        if (variant.toULongLong() <= static_cast<uint64_t>(std::numeric_limits<qint64>::max()))
            return variant.toLongLong();
        Q_FALLTHROUGH();
    case QMetaType::Float16:
    case QMetaType::Float:
    case QMetaType::Double:
        return variant.toDouble();
    case QMetaType::QString:
        return variant.toString();
    case QMetaType::QStringList:
        return QCborArray::fromStringList(variant.toStringList());
    case QMetaType::QByteArray:
        return variant.toByteArray();
#if QT_CONFIG(datestring)
    case QMetaType::QDateTime:
        return QCborValue(variant.toDateTime());
#endif
#ifndef QT_BOOTSTRAPPED
    case QMetaType::QUrl:
        return QCborValue(variant.toUrl());
    case QMetaType::QUuid:
        return QCborValue(variant.toUuid());
#endif
    case QMetaType::QVariantList:
        return QCborArray::fromVariantList(variant.toList());
    case QMetaType::QVariantMap:
        return QCborMap::fromVariantMap(variant.toMap());
    case QMetaType::QVariantHash:
        return QCborMap::fromVariantHash(variant.toHash());
#ifndef QT_BOOTSTRAPPED
#if QT_CONFIG(regularexpression)
    case QMetaType::QRegularExpression:
        return QCborValue(variant.toRegularExpression());
#endif
    case QMetaType::QJsonValue:
        return fromJsonValue(variant.toJsonValue());
    case QMetaType::QJsonObject:
        return QCborMap::fromJsonObject(variant.toJsonObject());
    case QMetaType::QJsonArray:
        return QCborArray::fromJsonArray(variant.toJsonArray());
    case QMetaType::QJsonDocument: {
        QJsonDocument doc = variant.toJsonDocument();
        if (doc.isArray())
            return QCborArray::fromJsonArray(doc.array());
        return QCborMap::fromJsonObject(doc.object());
    }
    case QMetaType::QCborValue:
        return qvariant_cast<QCborValue>(variant);
    case QMetaType::QCborArray:
        return qvariant_cast<QCborArray>(variant);
    case QMetaType::QCborMap:
        return qvariant_cast<QCborMap>(variant);
    case QMetaType::QCborSimpleType:
        return qvariant_cast<QCborSimpleType>(variant);
#endif
    default:
        break;
    }

    if (variant.isNull())
        return QCborValue(nullptr);

    QString string = variant.toString();
    if (string.isNull())
        return QCborValue();        // undefined
    return string;
}